

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_AzureStoragePutBlockList
          (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE azureStorageClientHandle)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  IOTHUB_CLIENT_RESULT result;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE azureStorageClientHandle_local;
  
  if (azureStorageClientHandle == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_AzureStoragePutBlockList",0xbe5,1,
                "invalid parameter azureStorageClientHandle=%p",0);
    }
    l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
  }
  else {
    l._4_4_ = IoTHubClient_LL_UploadToBlob_PutBlockList(azureStorageClientHandle);
  }
  return l._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_AzureStoragePutBlockList(IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE azureStorageClientHandle)
{
    IOTHUB_CLIENT_RESULT result;

    if (azureStorageClientHandle == NULL)
    {
        LogError("invalid parameter azureStorageClientHandle=%p", azureStorageClientHandle);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        result = IoTHubClient_LL_UploadToBlob_PutBlockList(azureStorageClientHandle);
    }

    return result;
}